

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

lu_mem singlestep(lua_State *L)

{
  ushort uVar1;
  global_State *g_00;
  lua_State *o;
  GCObject *o_00;
  int iVar2;
  GCObject **nextlist;
  global_State *g;
  lu_mem lVar3;
  
  g_00 = L->l_G;
  if (g_00->gcstopem != '\0') {
    __assert_fail("!g->gcstopem",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x68e,"lu_mem singlestep(lua_State *)");
  }
  g_00->gcstopem = '\x01';
  switch(g_00->gcstate) {
  case '\0':
    if (g_00->gray != (GCObject *)0x0) {
      lVar3 = propagatemark(g_00);
      goto LAB_00115783;
    }
    g_00->gcstate = '\x01';
    break;
  case '\x01':
    lVar3 = atomic(L);
    entersweep(L);
    g_00->GCestimate = g_00->GCdebt + g_00->totalbytes;
    goto LAB_00115783;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x6c3,"lu_mem singlestep(lua_State *)");
  case '\x03':
    nextlist = &g_00->finobj;
    iVar2 = 4;
    goto LAB_0011573b;
  case '\x04':
    nextlist = &g_00->tobefnz;
    iVar2 = 5;
    goto LAB_0011573b;
  case '\x05':
    iVar2 = 6;
    nextlist = (GCObject **)0x0;
LAB_0011573b:
    iVar2 = sweepstep(L,g_00,iVar2,nextlist);
    lVar3 = (lu_mem)iVar2;
    goto LAB_00115783;
  case '\x06':
    checkSizes(L,g_00);
    g_00->gcstate = '\a';
    break;
  case '\a':
    if ((g_00->tobefnz != (GCObject *)0x0) && (g_00->gcemergency == '\0')) {
      lVar3 = 0;
      g_00->gcstopem = '\0';
      while (((int)lVar3 != 500 && (g_00->tobefnz != (GCObject *)0x0))) {
        GCTM(L);
        lVar3 = lVar3 + 0x32;
      }
      goto LAB_00115783;
    }
    g_00->gcstate = '\b';
    break;
  case '\b':
    g_00->allweak = (GCObject *)0x0;
    g_00->gray = (GCObject *)0x0;
    g_00->grayagain = (GCObject *)0x0;
    g_00->weak = (GCObject *)0x0;
    g_00->ephemeron = (GCObject *)0x0;
    o = g_00->mainthread;
    if ((o->marked & 0x18) != 0) {
      if (9 < (o->tt & 0xe)) {
        __assert_fail("(((g->mainthread)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x1ea,"void restartcollection(global_State *)");
      }
      reallymarkobject(g_00,(GCObject *)o);
    }
    uVar1 = (g_00->l_registry).tt_;
    if ((short)uVar1 < 0) {
      o_00 = (g_00->l_registry).value_.gc;
      if ((uVar1 & 0x7f) != (ushort)o_00->tt) {
LAB_00115818:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x1eb,"void restartcollection(global_State *)");
      }
      if ((g_00->mainthread != (lua_State *)0x0) &&
         (((g_00->mainthread->l_G->currentwhite ^ 0x18) & o_00->marked) != 0)) goto LAB_00115818;
      if ((o_00->marked & 0x18) != 0) {
        reallymarkobject(g_00,o_00);
      }
    }
    markmt(g_00);
    markbeingfnz(g_00);
    g_00->gcstate = '\0';
    lVar3 = 1;
    goto LAB_00115783;
  }
  lVar3 = 0;
LAB_00115783:
  g_00->gcstopem = '\0';
  return lVar3;
}

Assistant:

static lu_mem singlestep (lua_State *L) {
  global_State *g = G(L);
  lu_mem work;
  lua_assert(!g->gcstopem);  /* collector is not reentrant */
  g->gcstopem = 1;  /* no emergency collections while collecting */
  switch (g->gcstate) {
    case GCSpause: {
      restartcollection(g);
      g->gcstate = GCSpropagate;
      work = 1;
      break;
    }
    case GCSpropagate: {
      if (g->gray == NULL) {  /* no more gray objects? */
        g->gcstate = GCSenteratomic;  /* finish propagate phase */
        work = 0;
      }
      else
        work = propagatemark(g);  /* traverse one gray object */
      break;
    }
    case GCSenteratomic: {
      work = atomic(L);  /* work is what was traversed by 'atomic' */
      entersweep(L);
      g->GCestimate = gettotalbytes(g);  /* first estimate */
      break;
    }
    case GCSswpallgc: {  /* sweep "regular" objects */
      work = sweepstep(L, g, GCSswpfinobj, &g->finobj);
      break;
    }
    case GCSswpfinobj: {  /* sweep objects with finalizers */
      work = sweepstep(L, g, GCSswptobefnz, &g->tobefnz);
      break;
    }
    case GCSswptobefnz: {  /* sweep objects to be finalized */
      work = sweepstep(L, g, GCSswpend, NULL);
      break;
    }
    case GCSswpend: {  /* finish sweeps */
      checkSizes(L, g);
      g->gcstate = GCScallfin;
      work = 0;
      break;
    }
    case GCScallfin: {  /* call remaining finalizers */
      if (g->tobefnz && !g->gcemergency) {
        g->gcstopem = 0;  /* ok collections during finalizers */
        work = runafewfinalizers(L, GCFINMAX) * GCFINALIZECOST;
      }
      else {  /* emergency mode or no more finalizers */
        g->gcstate = GCSpause;  /* finish collection */
        work = 0;
      }
      break;
    }
    default: lua_assert(0); return 0;
  }
  g->gcstopem = 0;
  return work;
}